

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<13,_0,_13,_0,_13>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  float *pfVar1;
  undefined4 *puVar2;
  int row;
  long lVar3;
  long lVar4;
  Vector<float,_3> res_2;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  float afStack_150 [6];
  float local_138 [4];
  float local_128 [2];
  ulong local_120;
  undefined4 local_118;
  float local_110 [4];
  float local_100 [4];
  float local_f0 [6];
  Matrix<float,_4,_4> local_d8;
  Matrix<float,_4,_4> local_98;
  Matrix<float,_4,_4> local_58;
  
  pfVar1 = (float *)&local_58;
  local_58.m_data.m_data[3].m_data[0] = 0.0;
  local_58.m_data.m_data[3].m_data[1] = 0.0;
  local_58.m_data.m_data[3].m_data[2] = 0.0;
  local_58.m_data.m_data[3].m_data[3] = 0.0;
  local_58.m_data.m_data[2].m_data[0] = 0.0;
  local_58.m_data.m_data[2].m_data[1] = 0.0;
  local_58.m_data.m_data[2].m_data[2] = 0.0;
  local_58.m_data.m_data[2].m_data[3] = 0.0;
  local_58.m_data.m_data[1].m_data[0] = 0.0;
  local_58.m_data.m_data[1].m_data[1] = 0.0;
  local_58.m_data.m_data[1].m_data[2] = 0.0;
  local_58.m_data.m_data[1].m_data[3] = 0.0;
  local_58.m_data.m_data[0].m_data[0] = 0.0;
  local_58.m_data.m_data[0].m_data[1] = 0.0;
  local_58.m_data.m_data[0].m_data[2] = 0.0;
  local_58.m_data.m_data[0].m_data[3] = 0.0;
  puVar2 = &s_constInMat4;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  pfVar1 = (float *)&local_98;
  local_98.m_data.m_data[3].m_data[0] = 0.0;
  local_98.m_data.m_data[3].m_data[1] = 0.0;
  local_98.m_data.m_data[3].m_data[2] = 0.0;
  local_98.m_data.m_data[3].m_data[3] = 0.0;
  local_98.m_data.m_data[2].m_data[0] = 0.0;
  local_98.m_data.m_data[2].m_data[1] = 0.0;
  local_98.m_data.m_data[2].m_data[2] = 0.0;
  local_98.m_data.m_data[2].m_data[3] = 0.0;
  local_98.m_data.m_data[1].m_data[0] = 0.0;
  local_98.m_data.m_data[1].m_data[1] = 0.0;
  local_98.m_data.m_data[1].m_data[2] = 0.0;
  local_98.m_data.m_data[1].m_data[3] = 0.0;
  local_98.m_data.m_data[0].m_data[0] = 0.0;
  local_98.m_data.m_data[0].m_data[1] = 0.0;
  local_98.m_data.m_data[0].m_data[2] = 0.0;
  local_98.m_data.m_data[0].m_data[3] = 0.0;
  puVar2 = &DAT_0224bb00;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar1 + lVar4) = *(undefined4 *)((long)puVar2 + lVar4);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x40);
    lVar3 = lVar3 + 1;
    pfVar1 = pfVar1 + 1;
    puVar2 = puVar2 + 1;
  } while (lVar3 != 4);
  afStack_150[0] = 2.2095234e-38;
  afStack_150[1] = 0.0;
  tcu::operator*(&local_d8,&local_58,&local_98);
  local_f0[0] = local_d8.m_data.m_data[0].m_data[0];
  local_f0[1] = local_d8.m_data.m_data[0].m_data[1];
  local_f0[2] = local_d8.m_data.m_data[0].m_data[2];
  local_100[0] = local_d8.m_data.m_data[1].m_data[1];
  local_100[1] = local_d8.m_data.m_data[1].m_data[2];
  local_100[2] = local_d8.m_data.m_data[1].m_data[3];
  local_138[0] = 0.0;
  local_138[1] = 0.0;
  local_138[2] = 0.0;
  lVar3 = 0;
  do {
    local_138[lVar3] = local_f0[lVar3] + local_100[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_110[0] = local_d8.m_data.m_data[2].m_data[2];
  local_110[1] = local_d8.m_data.m_data[2].m_data[3];
  local_110[2] = local_d8.m_data.m_data[2].m_data[0];
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_120 = local_120 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    local_128[lVar3] = local_138[lVar3] + local_110[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_f0[3] = local_d8.m_data.m_data[3].m_data[3];
  local_f0[4] = local_d8.m_data.m_data[3].m_data[0];
  local_f0[5] = local_d8.m_data.m_data[3].m_data[1];
  afStack_150[2] = 0.0;
  afStack_150[3] = 0.0;
  afStack_150[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_150[lVar3 + 2] = local_128[lVar3] + local_f0[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_120 = 0x100000000;
  local_118 = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)local_128[lVar3]] = afStack_150[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) * getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}